

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::DiskSourceTree::~DiskSourceTree(DiskSourceTree *this)

{
  ~DiskSourceTree(this);
  operator_delete(this);
  return;
}

Assistant:

DiskSourceTree::~DiskSourceTree() {}